

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Butterworth.cpp
# Opt level: O3

void __thiscall
Iir::Butterworth::AnalogLowShelf::design(AnalogLowShelf *this,int numPoles,double gainDb)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  double __x;
  undefined4 local_88;
  undefined4 uStack_84;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (this->m_numPoles == numPoles) {
    if ((this->m_gainDb == gainDb) && (!NAN(this->m_gainDb) && !NAN(gainDb))) {
      return;
    }
  }
  this->m_numPoles = numPoles;
  this->m_gainDb = gainDb;
  (this->super_LayoutBase).m_numPoles = 0;
  dVar1 = pow(10.0,gainDb / 20.0);
  dVar1 = pow(dVar1,1.0 / (double)(numPoles * 2));
  dVar5 = -1.0 / dVar1;
  if (1 < numPoles) {
    uVar3 = (uint)numPoles >> 1;
    local_88 = SUB84(dVar1,0);
    uStack_84 = (undefined4)((ulong)-dVar1 >> 0x20);
    local_58 = local_88;
    uStack_54 = uStack_84;
    uStack_50 = local_88;
    uStack_4c = uStack_84;
    iVar4 = 1;
    local_48 = dVar5;
    uStack_40 = dVar5;
    do {
      __x = (0.5 - (double)iVar4 / (double)(numPoles * 2)) * 3.141592653589793;
      dVar2 = cos(__x);
      dStack_60 = sin(__x);
      local_68 = dVar2 * local_48;
      dStack_60 = dStack_60 * uStack_40;
      dVar2 = cos(__x);
      dStack_70 = sin(__x);
      local_78 = dVar2 * (double)CONCAT44(uStack_54,local_58);
      dStack_70 = dStack_70 * (double)CONCAT44(uStack_4c,uStack_50);
      LayoutBase::addPoleZeroConjugatePairs
                (&this->super_LayoutBase,(complex_t *)&local_68,(complex_t *)&local_78);
      iVar4 = iVar4 + 2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if ((numPoles & 1U) != 0) {
    dStack_60 = 0.0;
    dStack_70 = 0.0;
    local_78 = -dVar1;
    local_68 = dVar5;
    LayoutBase::add(&this->super_LayoutBase,(complex_t *)&local_68,(complex_t *)&local_78);
  }
  return;
}

Assistant:

void AnalogLowShelf::design (int numPoles, double gainDb)
{
  if (m_numPoles != numPoles ||
      m_gainDb != gainDb)
  {
    m_numPoles = numPoles;
    m_gainDb = gainDb;

    reset ();

    const double n2 = numPoles * 2;
    const double g = pow (pow (10., gainDb/20), 1. / n2);
    const double gp = -1. / g;
    const double gz = -g;

    const int pairs = numPoles / 2;
    for (int i = 1; i <= pairs; ++i)
    {
      const double theta = doublePi * (0.5 - (2 * i - 1) / n2);
      addPoleZeroConjugatePairs (std::polar (gp, theta), std::polar (gz, theta));
    }
    
    if (numPoles & 1)
      add (gp, gz);
  }
}